

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_export.cpp
# Opt level: O3

void __thiscall
duckdb::PhysicalExport::PhysicalExport
          (PhysicalExport *this,vector<duckdb::LogicalType,_true> *types,CopyFunction *function,
          unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *info,
          idx_t estimated_cardinality,
          unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>,_true>
          *exported_tables)

{
  pointer pLVar1;
  pointer pLVar2;
  pointer pLVar3;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  pLVar1 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pLVar2 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar3 = (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (types->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalOperator_0196ff50;
  (this->super_PhysicalOperator).type = EXPORT;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_PhysicalOperator).children.
  super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  .
  super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = pLVar2;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = pLVar3;
  (this->super_PhysicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pLVar1;
  local_28 = 0;
  local_38 = 0;
  uStack_30 = 0;
  (this->super_PhysicalOperator).estimated_cardinality = estimated_cardinality;
  (this->super_PhysicalOperator).sink_state.
  super_unique_ptr<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t.
  super___uniq_ptr_impl<duckdb::GlobalSinkState,_std::default_delete<duckdb::GlobalSinkState>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::GlobalSinkState_*,_std::default_delete<duckdb::GlobalSinkState>_>.
  super__Head_base<0UL,_duckdb::GlobalSinkState_*,_false>._M_head_impl = (GlobalSinkState *)0x0;
  (this->super_PhysicalOperator).op_state.
  super_unique_ptr<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::GlobalOperatorState,_std::default_delete<duckdb::GlobalOperatorState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalOperatorState_*,_std::default_delete<duckdb::GlobalOperatorState>_>
  .super__Head_base<0UL,_duckdb::GlobalOperatorState_*,_false>._M_head_impl =
       (GlobalOperatorState *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->super_PhysicalOperator).lock.super___mutex_base._M_mutex + 0x10) = 0
  ;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_PhysicalOperator).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_38);
  (this->super_PhysicalOperator)._vptr_PhysicalOperator =
       (_func_int **)&PTR__PhysicalExport_01995f80;
  CopyFunction::CopyFunction(&this->function,function);
  (this->info).super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
       (info->super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)._M_t.
       super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
       super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl;
  (info->super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl = (CopyInfo *)0x0;
  (this->exported_tables).
  super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>._M_t.
  super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>.
  super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl =
       (exported_tables->
       super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>
       .super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl;
  (exported_tables->
  super_unique_ptr<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>)._M_t.
  super___uniq_ptr_impl<duckdb::BoundExportData,_std::default_delete<duckdb::BoundExportData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::BoundExportData_*,_std::default_delete<duckdb::BoundExportData>_>.
  super__Head_base<0UL,_duckdb::BoundExportData_*,_false>._M_head_impl = (BoundExportData *)0x0;
  return;
}

Assistant:

PhysicalExport::PhysicalExport(vector<LogicalType> types, CopyFunction function, unique_ptr<CopyInfo> info,
                               idx_t estimated_cardinality, unique_ptr<BoundExportData> exported_tables)
    : PhysicalOperator(PhysicalOperatorType::EXPORT, std::move(types), estimated_cardinality),
      function(std::move(function)), info(std::move(info)), exported_tables(std::move(exported_tables)) {
}